

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  uint16 uVar2;
  bool bVar3;
  int iVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  char *str;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  Rune r;
  char buf [4];
  int local_50;
  char local_4c [4];
  bool *local_48;
  Regexp *local_40;
  Regexp **local_38;
  
  bVar3 = false;
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    uVar1 = this->nsub_;
    if (uVar1 < 2) {
      paVar6 = &this->field_5;
    }
    else {
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    uVar10 = 0;
    bVar11 = uVar1 != 0;
    if ((bVar11) && (paVar6->subone_->op_ == '\x12')) {
      uVar10 = 0;
      do {
        if ((ulong)uVar1 - 1 == uVar10) {
          bVar11 = uVar10 + 1 < (ulong)uVar1;
          uVar10 = (ulong)uVar1;
          goto LAB_001360ca;
        }
        lVar7 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((paVar6[lVar7].subone_)->op_ == '\x12');
      bVar11 = uVar10 < uVar1;
    }
LAB_001360ca:
    bVar3 = false;
    if (((int)uVar10 != 0) && (bVar11)) {
      uVar8 = uVar10 & 0xffffffff;
      pRVar5 = paVar6[uVar8].subone_;
      local_48 = foldcase;
      if (pRVar5->op_ == '\x03') {
        if (((pRVar5->parse_flags_ & 0x20) == 0) && (0x7f < (pRVar5->field_7).field_0.max_)) {
          runetochar(local_4c,&(pRVar5->field_7).rune_);
          std::__cxx11::string::append((char *)prefix,(ulong)local_4c);
        }
        else {
          std::__cxx11::string::_M_replace_aux((ulong)prefix,prefix->_M_string_length,0,'\x01');
        }
      }
      else {
        if (pRVar5->op_ != '\x04') {
          return false;
        }
        iVar4 = (pRVar5->field_7).field_0.max_;
        if ((pRVar5->parse_flags_ & 0x20) == 0) {
          local_40 = this;
          local_38 = suffix;
          std::__cxx11::string::resize((ulong)prefix,(char)(iVar4 << 2));
          str = (prefix->_M_dataplus)._M_p;
          if (0 < (pRVar5->field_7).field_0.max_) {
            lVar7 = 0;
            do {
              local_50 = *(int *)((long)&(((pRVar5->field_7).field_1.name_)->_M_dataplus)._M_p +
                                 lVar7 * 4);
              if (local_50 < 0x80) {
                *str = (char)local_50;
                str = str + 1;
              }
              else {
                iVar4 = runetochar(str,&local_50);
                str = str + iVar4;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (pRVar5->field_7).field_0.max_);
          }
          std::__cxx11::string::resize((ulong)prefix,(char)str - (char)(prefix->_M_dataplus)._M_p);
          this = local_40;
          suffix = local_38;
        }
        else {
          std::__cxx11::string::resize((ulong)prefix,(char)iVar4);
          if (0 < (pRVar5->field_7).field_0.max_) {
            lVar7 = 0;
            do {
              (prefix->_M_dataplus)._M_p[lVar7] =
                   *(char *)((long)&(((pRVar5->field_7).field_1.name_)->_M_dataplus)._M_p +
                            lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 < (pRVar5->field_7).field_0.max_);
          }
        }
      }
      *local_48 = (bool)((byte)(paVar6[uVar8].subone_)->parse_flags_ & 1);
      uVar9 = (int)uVar10 + 1;
      if (uVar9 < this->nsub_) {
        uVar1 = this->nsub_;
        if (uVar9 < uVar1) {
          uVar8 = uVar8 + 1;
          do {
            Incref(paVar6[uVar8].subone_);
            uVar8 = uVar8 + 1;
            uVar1 = this->nsub_;
          } while (uVar8 < uVar1);
        }
        pRVar5 = ConcatOrAlternate(kRegexpConcat,&paVar6[uVar9].subone_,uVar1 - uVar9,
                                   (uint)this->parse_flags_,false);
      }
      else {
        pRVar5 = (Regexp *)operator_new(0x28);
        uVar2 = this->parse_flags_;
        pRVar5->op_ = '\x02';
        pRVar5->simple_ = '\0';
        pRVar5->parse_flags_ = uVar2;
        pRVar5->ref_ = 1;
        *(undefined8 *)((long)&pRVar5->down_ + 6) = 0;
        *(undefined8 *)((long)&(pRVar5->field_7).field_3.cc_ + 6) = 0;
        *(undefined8 *)&pRVar5->nsub_ = 0;
        *(undefined8 *)((long)&pRVar5->field_5 + 6) = 0;
        *(undefined2 *)((long)&pRVar5->field_7 + 0xe) = 0;
      }
      *suffix = pRVar5;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool Regexp::RequiredPrefix(string *prefix, bool *foldcase, Regexp** suffix) {
  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;
  if (op_ != kRegexpConcat)
    return false;

  // Some number of anchors, then a literal or concatenation.
  int i = 0;
  Regexp** sub = this->sub();
  while (i < nsub_ && sub[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;

  Regexp* re = sub[i];
  switch (re->op_) {
    default:
      return false;

    case kRegexpLiteralString:
      // Convert to string in proper encoding.
      if (re->parse_flags() & Latin1) {
        prefix->resize(re->nrunes_);
        for (int j = 0; j < re->nrunes_; j++)
          (*prefix)[j] = static_cast<char>(re->runes_[j]);
      } else {
        // Convert to UTF-8 in place.
        // Assume worst-case space and then trim.
        prefix->resize(re->nrunes_ * UTFmax);
        char *p = &(*prefix)[0];
        for (int j = 0; j < re->nrunes_; j++) {
          Rune r = re->runes_[j];
          if (r < Runeself)
            *p++ = static_cast<char>(r);
          else
            p += runetochar(p, &r);
        }
        prefix->resize(p - &(*prefix)[0]);
      }
      break;

    case kRegexpLiteral:
      if ((re->parse_flags() & Latin1) || re->rune_ < Runeself) {
        prefix->append(1, static_cast<char>(re->rune_));
      } else {
        char buf[UTFmax];
        prefix->append(buf, runetochar(buf, &re->rune_));
      }
      break;
  }
  *foldcase = (sub[i]->parse_flags() & FoldCase) != 0;
  i++;

  // The rest.
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub[j]->Incref();
    re = Concat(sub + i, nsub_ - i, parse_flags());
  } else {
    re = new Regexp(kRegexpEmptyMatch, parse_flags());
  }
  *suffix = re;
  return true;
}